

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

void spell_shocking_grasp(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  int dam;
  bool bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar2 = 0x32;
  if (level < 0x32) {
    uVar2 = level;
  }
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  iVar3 = number_range(spell_shocking_grasp::dam_each[uVar4] / 2,
                       spell_shocking_grasp::dam_each[uVar4] * 2);
  bVar1 = saves_spell((int)uVar4,(CHAR_DATA *)vo,6);
  dam = iVar3 / 2;
  if (!bVar1) {
    dam = iVar3;
  }
  damage_old(ch,(CHAR_DATA *)vo,dam,sn,6,true);
  return;
}

Assistant:

void spell_shocking_grasp(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	static const int dam_each[] =
	{
		0,  0,  0,  0,  16, 18, 20, 20, 25, 29, 33, 36, 39, 39, 39, 40, 40,
		41, 41, 42, 42, 43, 43, 44, 44, 45, 45, 46, 46, 47, 47, 48, 48, 49,
		49, 50, 50, 51, 51, 52, 52, 53, 53, 54, 54, 55, 55, 56, 56, 57, 57
	};

	int dam;

	level = std::min(level, (int)sizeof(dam_each) / (int)sizeof(dam_each[0]) - 1);
	level = std::max(0, level);

	dam = number_range(dam_each[level] / 2, dam_each[level] * 2);

	if (saves_spell(level, victim, DAM_LIGHTNING))
		dam /= 2;

	damage_old(ch, victim, dam, sn, DAM_LIGHTNING, true);
}